

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

SurfaceMesh * __thiscall polyscope::SurfaceMesh::setEdgeColor(SurfaceMesh *this,vec3 val)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar3;
  mapped_type *pmVar4;
  undefined8 in_XMM0_Qb;
  
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = val._0_8_;
  uVar1 = vmovlps_avx(auVar2);
  (this->edgeColor).value.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
  (this->edgeColor).value.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar1 >> 0x20);
  (this->edgeColor).value.field_2 = val.field_2;
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&detail::persistentCache_glmvec3,&(this->edgeColor).name);
  aVar3 = (this->edgeColor).value.field_1;
  pmVar4->field_0 = (this->edgeColor).value.field_0;
  pmVar4->field_1 = aVar3;
  pmVar4->field_2 = (this->edgeColor).value.field_2;
  (this->edgeColor).holdsDefaultValue = false;
  requestRedraw();
  return this;
}

Assistant:

SurfaceMesh* SurfaceMesh::setEdgeColor(glm::vec3 val) {
  edgeColor = val;
  requestRedraw();
  return this;
}